

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
QPDFJob::doProcess(QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,
                  function<void_(QPDF_*,_const_char_*)> *fn,char *password,bool empty,
                  bool used_for_input,bool main_input)

{
  char *pcVar1;
  function<void_(QPDF_*,_const_char_*)> *pfVar2;
  bool bVar3;
  element_type *peVar4;
  size_type sVar5;
  reference ppcVar6;
  logic_error *this_00;
  iterator next;
  QPDFExc *anon_var_0;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_168;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_160;
  iterator iter_1;
  value_type pcStack_150;
  bool warned;
  reference local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *iter;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> passwords;
  string local_108;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passwords_str;
  function<void_(QPDF_*,_const_char_*)> local_c8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_50 [8];
  string ptemp;
  bool main_input_local;
  bool used_for_input_local;
  char *pcStack_28;
  bool empty_local;
  char *password_local;
  function<void_(QPDF_*,_const_char_*)> *fn_local;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf_local;
  QPDFJob *this_local;
  
  ptemp.field_2._M_local_buf[0xd] = main_input;
  ptemp.field_2._M_local_buf[0xe] = used_for_input;
  ptemp.field_2._M_local_buf[0xf] = empty;
  pcStack_28 = password;
  password_local = (char *)fn;
  fn_local = (function<void_(QPDF_*,_const_char_*)> *)pdf;
  pdf_local = (unique_ptr<QPDF,_std::default_delete<QPDF>_> *)this;
  std::__cxx11::string::string(local_50);
  if (((pcStack_28 != (char *)0x0) &&
      (peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this), (peVar4->password_is_hex_key & 1U) == 0)) &&
     (peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this), peVar4->password_mode == pm_hex_bytes)) {
    QTC::TC("qpdf","QPDFJob input password hex-bytes",0);
    pcVar1 = pcStack_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar1,&local_a1);
    QUtil::hex_decode(&local_80,&local_a0);
    std::__cxx11::string::operator=(local_50,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    pcStack_28 = (char *)std::__cxx11::string::c_str();
  }
  if (((pcStack_28 == (char *)0x0) || ((ptemp.field_2._M_local_buf[0xf] & 1U) != 0)) ||
     ((peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this), (peVar4->password_is_hex_key & 1U) != 0 ||
      (peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this), pcVar1 = pcStack_28,
      (peVar4->suppress_password_recovery & 1U) != 0)))) {
    pfVar2 = fn_local;
    std::function<void_(QPDF_*,_const_char_*)>::function(&local_c8,fn);
    doProcessOnce(this,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)pfVar2,&local_c8,pcStack_28,
                  (bool)(ptemp.field_2._M_local_buf[0xf] & 1),
                  (bool)(ptemp.field_2._M_local_buf[0xe] & 1),
                  (bool)(ptemp.field_2._M_local_buf[0xd] & 1));
    std::function<void_(QPDF_*,_const_char_*)>::~function(&local_c8);
    passwords_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,pcVar1,
               (allocator<char> *)
               ((long)&passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    QUtil::possible_repaired_encodings
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_e8,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&passwords.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e8);
    iter = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&iter), bVar3) {
      local_148 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      pcStack_150 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,
                 &stack0xfffffffffffffeb0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    if (1 < sVar5) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,
                 &stack0xffffffffffffffd8);
    }
    iter_1._M_current._7_1_ = 0;
    local_160._M_current =
         (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    local_168._M_current =
         (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    bVar3 = __gnu_cxx::operator!=(&local_160,&local_168);
    pfVar2 = fn_local;
    if (!bVar3) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"do_process returned");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::function<void_(QPDF_*,_const_char_*)>::function
              ((function<void_(QPDF_*,_const_char_*)> *)&anon_var_0,fn);
    ppcVar6 = __gnu_cxx::
              __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_160);
    doProcessOnce(this,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)pfVar2,
                  (function<void_(QPDF_*,_const_char_*)> *)&anon_var_0,*ppcVar6,
                  (bool)(ptemp.field_2._M_local_buf[0xf] & 1),
                  (bool)(ptemp.field_2._M_local_buf[0xe] & 1),
                  (bool)(ptemp.field_2._M_local_buf[0xd] & 1));
    std::function<void_(QPDF_*,_const_char_*)>::~function
              ((function<void_(QPDF_*,_const_char_*)> *)&anon_var_0);
    passwords_str.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void
QPDFJob::doProcess(
    std::unique_ptr<QPDF>& pdf,
    std::function<void(QPDF*, char const*)> fn,
    char const* password,
    bool empty,
    bool used_for_input,
    bool main_input)
{
    // If a password has been specified but doesn't work, try other passwords that are equivalent in
    // different character encodings. This makes it possible to open PDF files that were encrypted
    // using incorrect string encodings. For example, if someone used a password encoded in PDF Doc
    // encoding or Windows code page 1252 for an AES-encrypted file or a UTF-8-encoded password on
    // an RC4-encrypted file, or if the password was properly encoded but the password given here
    // was incorrectly encoded, there's a good chance we'd succeed here.

    std::string ptemp;
    if (password && (!m->password_is_hex_key)) {
        if (m->password_mode == QPDFJob::pm_hex_bytes) {
            // Special case: handle --password-mode=hex-bytes for input password as well as output
            // password
            QTC::TC("qpdf", "QPDFJob input password hex-bytes");
            ptemp = QUtil::hex_decode(password);
            password = ptemp.c_str();
        }
    }
    if ((password == nullptr) || empty || m->password_is_hex_key || m->suppress_password_recovery) {
        // There is no password, or we're not doing recovery, so just do the normal processing with
        // the supplied password.
        doProcessOnce(pdf, fn, password, empty, used_for_input, main_input);
        return;
    }

    // Get a list of otherwise encoded strings. Keep in scope for this method.
    std::vector<std::string> passwords_str = QUtil::possible_repaired_encodings(password);
    // Represent to char const*, as required by the QPDF class.
    std::vector<char const*> passwords;
    for (auto const& iter: passwords_str) {
        passwords.push_back(iter.c_str());
    }
    // We always try the supplied password first because it is the first string returned by
    // possible_repaired_encodings. If there is more than one option, go ahead and put the supplied
    // password at the end so that it's that decoding attempt whose exception is thrown.
    if (passwords.size() > 1) {
        passwords.push_back(password);
    }

    // Try each password. If one works, return the resulting object. If they all fail, throw the
    // exception thrown by the final attempt, which, like the first attempt, will be with the
    // supplied password.
    bool warned = false;
    for (auto iter = passwords.begin(); iter != passwords.end(); ++iter) {
        try {
            doProcessOnce(pdf, fn, *iter, empty, used_for_input, main_input);
            return;
        } catch (QPDFExc&) {
            auto next = iter;
            ++next;
            if (next == passwords.end()) {
                throw;
            }
        }
        if (!warned) {
            warned = true;
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix
                  << ": supplied password didn't work; trying other passwords based on "
                     "interpreting password with different string encodings\n";
            });
        }
    }
    // Should not be reachable
    throw std::logic_error("do_process returned");
}